

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTry
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Try *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  Expression **childp;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->body,
             (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.
                   id);
  __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  pAVar1 = (ArenaVector<wasm::Expression_*> *)
           (curr->catchBodies).
           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  local_40 = (undefined1  [8])&curr->catchBodies;
  while ((__begin2.parent != pAVar1 || (local_40 != (undefined1  [8])&curr->catchBodies))) {
    childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
             operator*((Iterator *)local_40);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,childp,
               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.
                     type.id);
    __begin2.parent =
         (ArenaVector<wasm::Expression_*> *)
         ((long)&((__begin2.parent)->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data +
         1);
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    note(&curr->body, curr->type);
    for (auto& expr : curr->catchBodies) {
      note(&expr, curr->type);
    }
  }